

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::AnsiUdpPortListSyntax::AnsiUdpPortListSyntax
          (AnsiUdpPortListSyntax *this,Token openParen,
          SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *ports,Token closeParen,Token semi)

{
  size_t sVar1;
  SyntaxNode *pSVar2;
  undefined4 uVar3;
  UdpPortDeclSyntax *pUVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *__range2;
  iterator_base<slang::syntax::UdpPortDeclSyntax_*> local_30;
  
  uVar6 = closeParen._0_8_;
  uVar5 = openParen._0_8_;
  (this->super_UdpPortListSyntax).super_SyntaxNode.kind = AnsiUdpPortList;
  (this->super_UdpPortListSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_UdpPortListSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (this->openParen).kind = (short)uVar5;
  (this->openParen).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->openParen).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->openParen).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->openParen).info = openParen.info;
  uVar3 = *(undefined4 *)&(ports->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar2 = (ports->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->ports).super_SyntaxListBase.super_SyntaxNode.kind =
       (ports->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->ports).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (this->ports).super_SyntaxListBase.super_SyntaxNode.parent = pSVar2;
  (this->ports).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (ports->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->ports).super_SyntaxListBase.childCount = (ports->super_SyntaxListBase).childCount;
  (this->ports).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_006a3438;
  sVar1 = (ports->elements)._M_extent._M_extent_value;
  (this->ports).elements._M_ptr = (ports->elements)._M_ptr;
  (this->ports).elements._M_extent._M_extent_value = sVar1;
  (this->closeParen).kind = (short)uVar6;
  (this->closeParen).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->closeParen).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->closeParen).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->closeParen).info = closeParen.info;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  (this->ports).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  local_30.index = 0;
  sVar1 = (this->ports).elements._M_extent._M_extent_value;
  local_30.list = &this->ports;
  for (; (local_30.list != &this->ports || (local_30.index != sVar1 + 1 >> 1));
      local_30.index = local_30.index + 1) {
    pUVar4 = SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::
             iterator_base<slang::syntax::UdpPortDeclSyntax_*>::dereference(&local_30);
    (pUVar4->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

AnsiUdpPortListSyntax(Token openParen, const SeparatedSyntaxList<UdpPortDeclSyntax>& ports, Token closeParen, Token semi) :
        UdpPortListSyntax(SyntaxKind::AnsiUdpPortList), openParen(openParen), ports(ports), closeParen(closeParen), semi(semi) {
        this->ports.parent = this;
        for (auto child : this->ports)
            child->parent = this;
    }